

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O0

WebPInfoStatus
ParseLossyFilterHeader(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  int iVar1;
  uint64_t *in_RCX;
  size_t in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int temp;
  int i;
  int update;
  int use_lf_delta;
  int sharpness;
  int level;
  int simple_filter;
  int local_44;
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint64_t *local_28;
  size_t local_20;
  uint8_t *local_18;
  long local_10;
  WebPInfoStatus local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = GetBits(in_RSI,in_RDX,1,(int *)&local_2c,in_RCX);
  if (iVar1 == 0) {
    if (*(int *)(local_10 + 0x70) != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
    }
    local_4 = WEBP_INFO_TRUNCATED_DATA;
  }
  else {
    iVar1 = GetBits(local_18,local_20,6,(int *)&local_30,local_28);
    if (iVar1 == 0) {
      if (*(int *)(local_10 + 0x70) != 0) {
        fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
      }
      local_4 = WEBP_INFO_TRUNCATED_DATA;
    }
    else {
      iVar1 = GetBits(local_18,local_20,3,(int *)&local_34,local_28);
      if (iVar1 == 0) {
        if (*(int *)(local_10 + 0x70) != 0) {
          fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
        }
        local_4 = WEBP_INFO_TRUNCATED_DATA;
      }
      else {
        iVar1 = GetBits(local_18,local_20,1,(int *)&local_38,local_28);
        if (iVar1 == 0) {
          if (*(int *)(local_10 + 0x70) != 0) {
            fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
          }
          local_4 = WEBP_INFO_TRUNCATED_DATA;
        }
        else {
          printf("  Simple filter:    %d\n",(ulong)local_2c);
          printf("  Level:            %d\n",(ulong)local_30);
          printf("  Sharpness:        %d\n",(ulong)local_34);
          printf("  Use lf delta:     %d\n",(ulong)local_38);
          if (local_38 != 0) {
            iVar1 = GetBits(local_18,local_20,1,(int *)&local_3c,local_28);
            if (iVar1 == 0) {
              if (*(int *)(local_10 + 0x70) != 0) {
                fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
              }
              return WEBP_INFO_TRUNCATED_DATA;
            }
            printf("  Update lf delta:  %d\n",(ulong)local_3c);
            if (local_3c != 0) {
              for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
                iVar1 = GetBits(local_18,local_20,1,&local_44,local_28);
                if (iVar1 == 0) {
                  if (*(int *)(local_10 + 0x70) != 0) {
                    fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                  }
                  return WEBP_INFO_TRUNCATED_DATA;
                }
                if ((local_44 != 0) &&
                   (iVar1 = GetBits(local_18,local_20,7,&local_44,local_28), iVar1 == 0)) {
                  if (*(int *)(local_10 + 0x70) != 0) {
                    fprintf(_stderr,"Error: %s\n","Truncated lossy bitstream.");
                  }
                  return WEBP_INFO_TRUNCATED_DATA;
                }
              }
            }
          }
          local_4 = WEBP_INFO_OK;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static WebPInfoStatus ParseLossyFilterHeader(const WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const bit_pos) {
  int simple_filter, level, sharpness, use_lf_delta;
  GET_BITS(simple_filter, 1);
  GET_BITS(level, 6);
  GET_BITS(sharpness, 3);
  GET_BITS(use_lf_delta, 1);
  printf("  Simple filter:    %d\n", simple_filter);
  printf("  Level:            %d\n", level);
  printf("  Sharpness:        %d\n", sharpness);
  printf("  Use lf delta:     %d\n", use_lf_delta);
  if (use_lf_delta) {
    int update;
    GET_BITS(update, 1);
    printf("  Update lf delta:  %d\n", update);
    if (update) {
      int i;
      for (i = 0; i < 4 + 4; ++i) {
        int temp;
        GET_BITS(temp, 1);
        if (temp) GET_BITS(temp, 7);
      }
    }
  }
  return WEBP_INFO_OK;
}